

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O0

int yyrefill(GREG *G)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  int yyn;
  GREG *G_local;
  
  while (G->buflen - G->pos < 0x200) {
    G->buflen = G->buflen << 1;
    pcVar3 = (char *)realloc(G->buf,(long)G->buflen);
    G->buf = pcVar3;
  }
  cVar1 = PVIP_input(G->buf + G->pos,G->data);
  iVar2 = (int)cVar1;
  if (iVar2 != 0) {
    G->limit = iVar2 + G->limit;
  }
  G_local._4_4_ = (uint)(iVar2 != 0);
  return G_local._4_4_;
}

Assistant:

YY_LOCAL(int) yyrefill(GREG *G)
{
  int yyn;
  while (G->buflen - G->pos < 512)
    {
      G->buflen *= 2;
      G->buf= (char*)YY_REALLOC(G->buf, G->buflen, G->data);
    }
  YY_INPUT((G->buf + G->pos), yyn, (G->buflen - G->pos), G->data);
  if (!yyn) return 0;
  G->limit += yyn;
  return 1;
}